

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_bypass_enc(opj_mqc_t *mqc,OPJ_UINT32 d)

{
  OPJ_UINT32 d_local;
  opj_mqc_t *mqc_local;
  
  if (mqc->ct == 0xdeadbeef) {
    mqc->ct = 8;
  }
  mqc->ct = mqc->ct - 1;
  mqc->c = mqc->c + (d << ((byte)mqc->ct & 0x1f));
  if (mqc->ct == 0) {
    *mqc->bp = (OPJ_BYTE)mqc->c;
    mqc->ct = 8;
    if (*mqc->bp == 0xff) {
      mqc->ct = 7;
    }
    mqc->bp = mqc->bp + 1;
    mqc->c = 0;
  }
  return;
}

Assistant:

void opj_mqc_bypass_enc(opj_mqc_t *mqc, OPJ_UINT32 d)
{
    if (mqc->ct == BYPASS_CT_INIT) {
        mqc->ct = 8;
    }
    mqc->ct--;
    mqc->c = mqc->c + (d << mqc->ct);
    if (mqc->ct == 0) {
        *mqc->bp = (OPJ_BYTE)mqc->c;
        mqc->ct = 8;
        /* If the previous byte was 0xff, make sure that the next msb is 0 */
        if (*mqc->bp == 0xff) {
            mqc->ct = 7;
        }
        mqc->bp++;
        mqc->c = 0;
    }
}